

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_socket.hpp
# Opt level: O2

bool __thiscall iutest::detail::SocketWriter::SendLn(SocketWriter *this,string *message)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,message,"\r\n");
  iVar1 = (*(this->super_IOutStream)._vptr_IOutStream[2])
                    (this,local_30._M_dataplus._M_p,local_30._M_string_length,1);
  std::__cxx11::string::~string((string *)&local_30);
  return SUB41(iVar1,0);
}

Assistant:

bool SendLn(const ::std::string& message)
    {
#ifdef IUTEST_OS_WINDOWS
        return Send(message + "\r\n");
#else
        return Send(message + "\r\n");
        //return Send(message + "\n");
#endif
    }